

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

uchar ot::commissioner::utils::Decode<unsigned_char>(uint8_t *aBuf,size_t aLength)

{
  if (aLength != 0) {
    return *aBuf;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils.hpp"
                ,0xa2,
                "T ot::commissioner::utils::Decode(const uint8_t *, size_t) [T = unsigned char]");
}

Assistant:

T Decode(const uint8_t *aBuf, size_t aLength)
{
    T ret = 0;

    ASSERT(aLength >= sizeof(T));

    for (size_t i = 0; i < sizeof(T); ++i)
    {
        ret = (ret << 8) | aBuf[i];
    }
    return ret;
}